

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong unaff_R12;
  size_t mask;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float fVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined4 uVar59;
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  float fVar78;
  float fVar79;
  uint uVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_2734;
  int local_271c;
  RTCIntersectArguments *local_2718;
  ulong local_2710;
  Geometry *local_2708;
  ulong local_2700;
  ulong local_26f8;
  ulong local_26f0;
  ulong local_26e8;
  ulong local_26e0;
  ulong *local_26d8;
  Scene *local_26d0;
  ulong local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  float local_2684;
  float local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  byte local_25bf;
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      local_26d8 = local_2390;
      aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl((undefined1  [16])aVar4,auVar37);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(auVar37,auVar66,1);
      bVar6 = (bool)((byte)uVar34 & 1);
      auVar38._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar4.x;
      bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar4.y;
      bVar6 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar4.z;
      bVar6 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar4.field_3.a;
      auVar37 = vrcp14ps_avx512vl(auVar38);
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = &DAT_3f8000003f800000;
      auVar39._12_4_ = 0x3f800000;
      auVar39 = vfnmadd213ps_avx512vl(auVar38,auVar37,auVar39);
      auVar38 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
      auVar41 = vbroadcastss_avx512vl(auVar38);
      auVar85 = ZEXT3264(auVar41);
      auVar37 = vmovshdup_avx(auVar38);
      auVar41 = vbroadcastsd_avx512vl(auVar37);
      auVar86 = ZEXT3264(auVar41);
      auVar39 = vshufpd_avx(auVar38,auVar38,1);
      auVar52._8_4_ = 2;
      auVar52._0_8_ = 0x200000002;
      auVar52._12_4_ = 2;
      auVar52._16_4_ = 2;
      auVar52._20_4_ = 2;
      auVar52._24_4_ = 2;
      auVar52._28_4_ = 2;
      auVar41 = vpermps_avx512vl(auVar52,ZEXT1632(auVar38));
      auVar87 = ZEXT3264(auVar41);
      fVar55 = auVar38._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar51._4_4_ = fVar55;
      auVar51._0_4_ = fVar55;
      auVar51._8_4_ = fVar55;
      auVar51._12_4_ = fVar55;
      auVar51._16_4_ = fVar55;
      auVar51._20_4_ = fVar55;
      auVar51._24_4_ = fVar55;
      auVar51._28_4_ = fVar55;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar88 = ZEXT3264(auVar41);
      auVar43 = ZEXT1632(CONCAT412(auVar38._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar38._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar38._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar55))));
      auVar42 = vpermps_avx512vl(auVar41,auVar43);
      auVar73 = ZEXT3264(auVar42);
      auVar41 = vpermps_avx2(auVar52,auVar43);
      local_26e0 = (ulong)(auVar38._0_4_ < 0.0) << 5;
      local_26e8 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x40;
      local_26f0 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
      local_26f8 = local_26e0 ^ 0x20;
      local_2700 = local_26e8 ^ 0x20;
      uVar59 = auVar7._0_4_;
      auVar58 = ZEXT3264(CONCAT428(uVar59,CONCAT424(uVar59,CONCAT420(uVar59,CONCAT416(uVar59,
                                                  CONCAT412(uVar59,CONCAT48(uVar59,CONCAT44(uVar59,
                                                  uVar59))))))));
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar44._16_4_ = 0x80000000;
      auVar44._20_4_ = 0x80000000;
      auVar44._24_4_ = 0x80000000;
      auVar44._28_4_ = 0x80000000;
      auVar43 = vxorps_avx512vl(auVar51,auVar44);
      auVar89 = ZEXT3264(auVar43);
      auVar42 = vxorps_avx512vl(auVar42,auVar44);
      auVar90 = ZEXT3264(auVar42);
      auVar41 = vxorps_avx512vl(auVar41,auVar44);
      auVar91 = ZEXT3264(auVar41);
      auVar41 = vbroadcastss_avx512vl(auVar40);
      auVar92 = ZEXT3264(auVar41);
      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar93 = ZEXT3264(auVar41);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar94 = ZEXT3264(auVar41);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar95 = ZEXT1664(auVar40);
      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar96 = ZEXT3264(auVar41);
      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar97 = ZEXT3264(auVar41);
      local_26c8 = local_26f0 ^ 0x20;
      uVar34 = local_26f0 ^ 0x20;
      do {
        do {
          do {
            if (local_26d8 == &local_23a0) {
              return;
            }
            pfVar1 = (float *)(local_26d8 + -1);
            local_26d8 = local_26d8 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar36 = *local_26d8;
          do {
            if ((uVar36 & 8) == 0) {
              auVar41 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + local_26e0),auVar89._0_32_
                                   ,auVar85._0_32_);
              auVar42 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + local_26e8),auVar90._0_32_
                                   ,auVar86._0_32_);
              auVar41 = vpmaxsd_avx2(auVar41,auVar42);
              auVar42 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + local_26f0),auVar91._0_32_
                                   ,auVar87._0_32_);
              auVar42 = vpmaxsd_avx512vl(auVar42,auVar92._0_32_);
              auVar41 = vpmaxsd_avx2(auVar41,auVar42);
              auVar73 = ZEXT3264(auVar41);
              auVar42 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + local_26f8),auVar89._0_32_
                                   ,auVar85._0_32_);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + local_2700),auVar90._0_32_
                                   ,auVar86._0_32_);
              auVar42 = vpminsd_avx2(auVar42,auVar43);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar34),auVar91._0_32_,
                                   auVar87._0_32_);
              auVar43 = vpminsd_avx2(auVar43,auVar58._0_32_);
              auVar42 = vpminsd_avx2(auVar42,auVar43);
              uVar17 = vpcmpd_avx512vl(auVar41,auVar42,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar17);
            }
            if ((uVar36 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar30 = 4;
              }
              else {
                auVar41 = *(undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0);
                auVar42 = ((undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0))[1];
                auVar43 = vmovdqa64_avx512vl(auVar93._0_32_);
                auVar52 = auVar73._0_32_;
                auVar43 = vpternlogd_avx512vl(auVar43,auVar52,auVar94._0_32_,0xf8);
                uVar36 = unaff_R12 & 0xffffffff;
                auVar44 = vpcompressd_avx512vl(auVar43);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar45._0_4_ = (uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * auVar43._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar43._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar43._8_4_;
                bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar45._12_4_ = (uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar43._12_4_;
                bVar6 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar45._16_4_ = (uint)bVar6 * auVar44._16_4_ | (uint)!bVar6 * auVar43._16_4_;
                bVar6 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar45._20_4_ = (uint)bVar6 * auVar44._20_4_ | (uint)!bVar6 * auVar43._20_4_;
                bVar6 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar45._24_4_ = (uint)bVar6 * auVar44._24_4_ | (uint)!bVar6 * auVar43._24_4_;
                bVar6 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar45._28_4_ = (uint)bVar6 * auVar44._28_4_ | (uint)!bVar6 * auVar43._28_4_;
                auVar43 = vpermt2q_avx512vl(auVar41,auVar45,auVar42);
                uVar36 = auVar43._0_8_;
                iVar29 = 0;
                uVar33 = unaff_R12 - 1 & unaff_R12;
                iVar30 = 0;
                if (uVar33 != 0) {
                  auVar43 = vpshufd_avx2(auVar45,0x55);
                  vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                  auVar44 = vpminsd_avx2(auVar45,auVar43);
                  auVar43 = vpmaxsd_avx2(auVar45,auVar43);
                  uVar33 = uVar33 - 1 & uVar33;
                  iVar30 = iVar29;
                  if (uVar33 == 0) {
                    auVar44 = vpermi2q_avx512vl(auVar44,auVar41,auVar42);
                    uVar36 = auVar44._0_8_;
                    auVar41 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                    *local_26d8 = auVar41._0_8_;
                    auVar41 = vpermd_avx2(auVar43,auVar52);
                    *(int *)(local_26d8 + 1) = auVar41._0_4_;
                    local_26d8 = local_26d8 + 2;
                  }
                  else {
                    auVar46 = vpshufd_avx2(auVar45,0xaa);
                    vpermt2q_avx512vl(auVar41,auVar46,auVar42);
                    auVar51 = vpminsd_avx2(auVar44,auVar46);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar46);
                    auVar46 = vpminsd_avx2(auVar43,auVar44);
                    auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                    uVar33 = uVar33 - 1 & uVar33;
                    if (uVar33 == 0) {
                      auVar44 = vpermi2q_avx512vl(auVar51,auVar41,auVar42);
                      uVar36 = auVar44._0_8_;
                      auVar44 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                      *local_26d8 = auVar44._0_8_;
                      auVar43 = vpermd_avx2(auVar43,auVar52);
                      *(int *)(local_26d8 + 1) = auVar43._0_4_;
                      auVar41 = vpermt2q_avx512vl(auVar41,auVar46,auVar42);
                      local_26d8[2] = auVar41._0_8_;
                      auVar41 = vpermd_avx2(auVar46,auVar52);
                      *(int *)(local_26d8 + 3) = auVar41._0_4_;
                      local_26d8 = local_26d8 + 4;
                    }
                    else {
                      auVar44 = vpshufd_avx2(auVar45,0xff);
                      vpermt2q_avx512vl(auVar41,auVar44,auVar42);
                      auVar47 = vpminsd_avx2(auVar51,auVar44);
                      auVar44 = vpmaxsd_avx2(auVar51,auVar44);
                      auVar51 = vpminsd_avx2(auVar46,auVar44);
                      auVar44 = vpmaxsd_avx2(auVar46,auVar44);
                      auVar46 = vpminsd_avx2(auVar43,auVar44);
                      auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                      uVar33 = uVar33 - 1 & uVar33;
                      if (uVar33 == 0) {
                        auVar44 = vpermi2q_avx512vl(auVar47,auVar41,auVar42);
                        uVar36 = auVar44._0_8_;
                        auVar44 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                        *local_26d8 = auVar44._0_8_;
                        auVar73 = ZEXT3264(auVar52);
                        auVar43 = vpermd_avx2(auVar43,auVar52);
                        *(int *)(local_26d8 + 1) = auVar43._0_4_;
                        auVar43 = vpermt2q_avx512vl(auVar41,auVar46,auVar42);
                        local_26d8[2] = auVar43._0_8_;
                        auVar43 = vpermd_avx2(auVar46,auVar52);
                        *(int *)(local_26d8 + 3) = auVar43._0_4_;
                        auVar41 = vpermt2q_avx512vl(auVar41,auVar51,auVar42);
                        local_26d8[4] = auVar41._0_8_;
                        auVar41 = vpermd_avx2(auVar51,auVar52);
                        *(int *)(local_26d8 + 5) = auVar41._0_4_;
                        local_26d8 = local_26d8 + 6;
                      }
                      else {
                        auVar45 = valignd_avx512vl(auVar45,auVar45,3);
                        auVar44 = vmovdqa64_avx512vl(auVar95._0_32_);
                        auVar44 = vpermt2d_avx512vl(auVar44,auVar96._0_32_,auVar47);
                        auVar44 = vpermt2d_avx512vl(auVar44,auVar97._0_32_,auVar51);
                        auVar51 = vpermt2d_avx512vl(auVar44,auVar97._0_32_,auVar46);
                        auVar44 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar43 = vpermt2d_avx512vl(auVar51,auVar44,auVar43);
                        auVar73 = ZEXT3264(auVar43);
                        uVar36 = uVar33;
                        do {
                          auVar44 = auVar73._0_32_;
                          auVar43 = vpermps_avx512vl(auVar88._0_32_,auVar45);
                          auVar45 = valignd_avx512vl(auVar45,auVar45,1);
                          vpermt2q_avx512vl(auVar41,auVar45,auVar42);
                          uVar36 = uVar36 - 1 & uVar36;
                          uVar17 = vpcmpd_avx512vl(auVar43,auVar44,5);
                          auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                          bVar28 = (byte)uVar17 << 1;
                          auVar44 = valignd_avx512vl(auVar44,auVar44,7);
                          bVar6 = (bool)((byte)uVar17 & 1);
                          auVar46._4_4_ = (uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar43._4_4_
                          ;
                          auVar46._0_4_ = auVar43._0_4_;
                          bVar6 = (bool)(bVar28 >> 2 & 1);
                          auVar46._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar43._8_4_
                          ;
                          bVar6 = (bool)(bVar28 >> 3 & 1);
                          auVar46._12_4_ =
                               (uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar43._12_4_;
                          bVar6 = (bool)(bVar28 >> 4 & 1);
                          auVar46._16_4_ =
                               (uint)bVar6 * auVar44._16_4_ | (uint)!bVar6 * auVar43._16_4_;
                          bVar6 = (bool)(bVar28 >> 5 & 1);
                          auVar46._20_4_ =
                               (uint)bVar6 * auVar44._20_4_ | (uint)!bVar6 * auVar43._20_4_;
                          bVar6 = (bool)(bVar28 >> 6 & 1);
                          auVar46._24_4_ =
                               (uint)bVar6 * auVar44._24_4_ | (uint)!bVar6 * auVar43._24_4_;
                          auVar46._28_4_ =
                               (uint)(bVar28 >> 7) * auVar44._28_4_ |
                               (uint)!(bool)(bVar28 >> 7) * auVar43._28_4_;
                          auVar73 = ZEXT3264(auVar46);
                        } while (uVar36 != 0);
                        lVar35 = POPCOUNT(uVar33) + 3;
                        do {
                          auVar43 = vpermi2q_avx512vl(auVar46,auVar41,auVar42);
                          *local_26d8 = auVar43._0_8_;
                          auVar44 = auVar73._0_32_;
                          auVar43 = vpermd_avx2(auVar44,auVar52);
                          *(int *)(local_26d8 + 1) = auVar43._0_4_;
                          auVar46 = valignd_avx512vl(auVar44,auVar44,1);
                          local_26d8 = local_26d8 + 2;
                          auVar73 = ZEXT3264(auVar46);
                          lVar35 = lVar35 + -1;
                        } while (lVar35 != 0);
                        auVar41 = vpermt2q_avx512vl(auVar41,auVar46,auVar42);
                        uVar36 = auVar41._0_8_;
                        auVar73 = ZEXT3264(auVar52);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar30 = 6;
            }
          } while (iVar30 == 0);
        } while (iVar30 != 6);
        local_23e0 = auVar73._0_32_;
        uVar34 = (ulong)((uint)uVar36 & 0xf);
        if (uVar34 != 8) {
          uVar36 = uVar36 & 0xfffffffffffffff0;
          lVar35 = 0;
          do {
            lVar31 = lVar35 * 0xe0;
            lVar2 = uVar36 + 0xd0 + lVar31;
            local_2660 = *(undefined8 *)(lVar2 + 0x10);
            uStack_2658 = *(undefined8 *)(lVar2 + 0x18);
            lVar2 = uVar36 + 0xc0 + lVar31;
            local_23c0 = *(undefined8 *)(lVar2 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar2 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            uStack_2650 = local_2660;
            uStack_2648 = uStack_2658;
            auVar61._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x60 + lVar31);
            auVar61._0_16_ = *(undefined1 (*) [16])(uVar36 + lVar31);
            auVar67._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x70 + lVar31);
            auVar67._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x10 + lVar31);
            auVar68._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x80 + lVar31);
            auVar68._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x20 + lVar31);
            auVar40 = *(undefined1 (*) [16])(uVar36 + 0x30 + lVar31);
            auVar41._16_16_ = auVar40;
            auVar41._0_16_ = auVar40;
            auVar7 = *(undefined1 (*) [16])(uVar36 + 0x40 + lVar31);
            auVar42._16_16_ = auVar7;
            auVar42._0_16_ = auVar7;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0x50 + lVar31);
            auVar43._16_16_ = auVar37;
            auVar43._0_16_ = auVar37;
            auVar39 = *(undefined1 (*) [16])(uVar36 + 0x90 + lVar31);
            auVar65._16_16_ = auVar39;
            auVar65._0_16_ = auVar39;
            auVar39 = *(undefined1 (*) [16])(uVar36 + 0xa0 + lVar31);
            auVar69._16_16_ = auVar39;
            auVar69._0_16_ = auVar39;
            auVar39 = *(undefined1 (*) [16])(uVar36 + 0xb0 + lVar31);
            auVar71._16_16_ = auVar39;
            auVar71._0_16_ = auVar39;
            auVar41 = vsubps_avx(auVar61,auVar41);
            auVar42 = vsubps_avx(auVar67,auVar42);
            auVar43 = vsubps_avx(auVar68,auVar43);
            auVar44 = vsubps_avx(auVar65,auVar61);
            auVar52 = vsubps_avx(auVar69,auVar67);
            auVar51 = vsubps_avx(auVar71,auVar68);
            auVar23._4_4_ = auVar42._4_4_ * auVar51._4_4_;
            auVar23._0_4_ = auVar42._0_4_ * auVar51._0_4_;
            auVar23._8_4_ = auVar42._8_4_ * auVar51._8_4_;
            auVar23._12_4_ = auVar42._12_4_ * auVar51._12_4_;
            auVar23._16_4_ = auVar42._16_4_ * auVar51._16_4_;
            auVar23._20_4_ = auVar42._20_4_ * auVar51._20_4_;
            auVar23._24_4_ = auVar42._24_4_ * auVar51._24_4_;
            auVar23._28_4_ = auVar40._12_4_;
            auVar39 = vfmsub231ps_fma(auVar23,auVar52,auVar43);
            auVar24._4_4_ = auVar43._4_4_ * auVar44._4_4_;
            auVar24._0_4_ = auVar43._0_4_ * auVar44._0_4_;
            auVar24._8_4_ = auVar43._8_4_ * auVar44._8_4_;
            auVar24._12_4_ = auVar43._12_4_ * auVar44._12_4_;
            auVar24._16_4_ = auVar43._16_4_ * auVar44._16_4_;
            auVar24._20_4_ = auVar43._20_4_ * auVar44._20_4_;
            auVar24._24_4_ = auVar43._24_4_ * auVar44._24_4_;
            auVar24._28_4_ = auVar7._12_4_;
            auVar7 = vfmsub231ps_fma(auVar24,auVar51,auVar41);
            auVar25._4_4_ = auVar41._4_4_ * auVar52._4_4_;
            auVar25._0_4_ = auVar41._0_4_ * auVar52._0_4_;
            auVar25._8_4_ = auVar41._8_4_ * auVar52._8_4_;
            auVar25._12_4_ = auVar41._12_4_ * auVar52._12_4_;
            auVar25._16_4_ = auVar41._16_4_ * auVar52._16_4_;
            auVar25._20_4_ = auVar41._20_4_ * auVar52._20_4_;
            auVar25._24_4_ = auVar41._24_4_ * auVar52._24_4_;
            auVar25._28_4_ = auVar37._12_4_;
            uVar59 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar82._4_4_ = uVar59;
            auVar82._0_4_ = uVar59;
            auVar82._8_4_ = uVar59;
            auVar82._12_4_ = uVar59;
            auVar82._16_4_ = uVar59;
            auVar82._20_4_ = uVar59;
            auVar82._24_4_ = uVar59;
            auVar82._28_4_ = uVar59;
            uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar83._4_4_ = uVar59;
            auVar83._0_4_ = uVar59;
            auVar83._8_4_ = uVar59;
            auVar83._12_4_ = uVar59;
            auVar83._16_4_ = uVar59;
            auVar83._20_4_ = uVar59;
            auVar83._24_4_ = uVar59;
            auVar83._28_4_ = uVar59;
            fVar55 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar84._4_4_ = fVar55;
            auVar84._0_4_ = fVar55;
            auVar84._8_4_ = fVar55;
            auVar84._12_4_ = fVar55;
            auVar84._16_4_ = fVar55;
            auVar84._20_4_ = fVar55;
            auVar84._24_4_ = fVar55;
            auVar84._28_4_ = fVar55;
            uVar59 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar47._4_4_ = uVar59;
            auVar47._0_4_ = uVar59;
            auVar47._8_4_ = uVar59;
            auVar47._12_4_ = uVar59;
            auVar47._16_4_ = uVar59;
            auVar47._20_4_ = uVar59;
            auVar47._24_4_ = uVar59;
            auVar47._28_4_ = uVar59;
            auVar45 = vsubps_avx512vl(auVar61,auVar47);
            auVar40 = vfmsub231ps_fma(auVar25,auVar44,auVar42);
            uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar48._4_4_ = uVar59;
            auVar48._0_4_ = uVar59;
            auVar48._8_4_ = uVar59;
            auVar48._12_4_ = uVar59;
            auVar48._16_4_ = uVar59;
            auVar48._20_4_ = uVar59;
            auVar48._24_4_ = uVar59;
            auVar48._28_4_ = uVar59;
            auVar46 = vsubps_avx512vl(auVar67,auVar48);
            uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar49._4_4_ = uVar59;
            auVar49._0_4_ = uVar59;
            auVar49._8_4_ = uVar59;
            auVar49._12_4_ = uVar59;
            auVar49._16_4_ = uVar59;
            auVar49._20_4_ = uVar59;
            auVar49._24_4_ = uVar59;
            auVar49._28_4_ = uVar59;
            auVar47 = vsubps_avx512vl(auVar68,auVar49);
            auVar48 = vmulps_avx512vl(auVar83,auVar47);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar46,auVar84);
            auVar49 = vmulps_avx512vl(auVar84,auVar45);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar47,auVar82);
            auVar50 = vmulps_avx512vl(auVar82,auVar46);
            local_25e0 = vfmsub231ps_avx512vl(auVar50,auVar45,auVar83);
            fVar60 = auVar40._0_4_;
            fVar62 = auVar40._4_4_;
            auVar26._4_4_ = fVar55 * fVar62;
            auVar26._0_4_ = fVar55 * fVar60;
            fVar63 = auVar40._8_4_;
            auVar26._8_4_ = fVar55 * fVar63;
            fVar64 = auVar40._12_4_;
            auVar26._12_4_ = fVar55 * fVar64;
            auVar26._16_4_ = fVar55 * 0.0;
            auVar26._20_4_ = fVar55 * 0.0;
            auVar26._24_4_ = fVar55 * 0.0;
            auVar26._28_4_ = fVar55;
            auVar40 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar7),auVar83);
            auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),ZEXT1632(auVar39),auVar82);
            auVar50._8_4_ = 0x7fffffff;
            auVar50._0_8_ = 0x7fffffff7fffffff;
            auVar50._12_4_ = 0x7fffffff;
            auVar50._16_4_ = 0x7fffffff;
            auVar50._20_4_ = 0x7fffffff;
            auVar50._24_4_ = 0x7fffffff;
            auVar50._28_4_ = 0x7fffffff;
            vandps_avx512vl(ZEXT1632(auVar40),auVar50);
            auVar51 = vmulps_avx512vl(auVar51,local_25e0);
            auVar52 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar52);
            auVar44 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar44);
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar18._16_4_ = 0x80000000;
            auVar18._20_4_ = 0x80000000;
            auVar18._24_4_ = 0x80000000;
            auVar18._28_4_ = 0x80000000;
            auVar52 = vandpd_avx512vl(ZEXT1632(auVar40),auVar18);
            uVar74 = auVar52._0_4_;
            auVar70._0_4_ = (float)(uVar74 ^ auVar44._0_4_);
            uVar75 = auVar52._4_4_;
            auVar70._4_4_ = (float)(uVar75 ^ auVar44._4_4_);
            uVar76 = auVar52._8_4_;
            auVar70._8_4_ = (float)(uVar76 ^ auVar44._8_4_);
            uVar77 = auVar52._12_4_;
            auVar70._12_4_ = (float)(uVar77 ^ auVar44._12_4_);
            fVar55 = auVar52._16_4_;
            auVar70._16_4_ = (float)((uint)fVar55 ^ auVar44._16_4_);
            fVar78 = auVar52._20_4_;
            auVar70._20_4_ = (float)((uint)fVar78 ^ auVar44._20_4_);
            fVar79 = auVar52._24_4_;
            auVar70._24_4_ = (float)((uint)fVar79 ^ auVar44._24_4_);
            uVar80 = auVar52._28_4_;
            auVar70._28_4_ = (float)(uVar80 ^ auVar44._28_4_);
            auVar43 = vmulps_avx512vl(auVar43,local_25e0);
            auVar42 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar49);
            auVar41 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar48);
            auVar72._0_4_ = (float)(uVar74 ^ auVar41._0_4_);
            auVar72._4_4_ = (float)(uVar75 ^ auVar41._4_4_);
            auVar72._8_4_ = (float)(uVar76 ^ auVar41._8_4_);
            auVar72._12_4_ = (float)(uVar77 ^ auVar41._12_4_);
            auVar72._16_4_ = (float)((uint)fVar55 ^ auVar41._16_4_);
            auVar72._20_4_ = (float)((uint)fVar78 ^ auVar41._20_4_);
            auVar72._24_4_ = (float)((uint)fVar79 ^ auVar41._24_4_);
            auVar72._28_4_ = (float)(uVar80 ^ auVar41._28_4_);
            uVar17 = vcmpps_avx512vl(auVar70,ZEXT832(0) << 0x20,5);
            uVar14 = vcmpps_avx512vl(auVar72,ZEXT832(0) << 0x20,5);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar40),ZEXT832(0) << 0x20,4);
            auVar81._0_4_ = auVar72._0_4_ + auVar70._0_4_;
            auVar81._4_4_ = auVar72._4_4_ + auVar70._4_4_;
            auVar81._8_4_ = auVar72._8_4_ + auVar70._8_4_;
            auVar81._12_4_ = auVar72._12_4_ + auVar70._12_4_;
            auVar81._16_4_ = auVar72._16_4_ + auVar70._16_4_;
            auVar81._20_4_ = auVar72._20_4_ + auVar70._20_4_;
            auVar81._24_4_ = auVar72._24_4_ + auVar70._24_4_;
            auVar81._28_4_ = auVar72._28_4_ + auVar70._28_4_;
            uVar16 = vcmpps_avx512vl(auVar81,local_25e0,2);
            local_25bf = (byte)uVar17 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
            if (local_25bf != 0) {
              auVar27._4_4_ = fVar62 * auVar47._4_4_;
              auVar27._0_4_ = fVar60 * auVar47._0_4_;
              auVar27._8_4_ = fVar63 * auVar47._8_4_;
              auVar27._12_4_ = fVar64 * auVar47._12_4_;
              auVar27._16_4_ = auVar47._16_4_ * 0.0;
              auVar27._20_4_ = auVar47._20_4_ * 0.0;
              auVar27._24_4_ = auVar47._24_4_ * 0.0;
              auVar27._28_4_ = auVar47._28_4_;
              auVar40 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar7),auVar27);
              auVar40 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar39),ZEXT1632(auVar40));
              local_2600._0_4_ = (float)(uVar74 ^ auVar40._0_4_);
              local_2600._4_4_ = (float)(uVar75 ^ auVar40._4_4_);
              local_2600._8_4_ = (float)(uVar76 ^ auVar40._8_4_);
              local_2600._12_4_ = (float)(uVar77 ^ auVar40._12_4_);
              local_2600._16_4_ = fVar55;
              local_2600._20_4_ = fVar78;
              local_2600._24_4_ = fVar79;
              local_2600._28_4_ = uVar80;
              uVar59 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar19._4_4_ = uVar59;
              auVar19._0_4_ = uVar59;
              auVar19._8_4_ = uVar59;
              auVar19._12_4_ = uVar59;
              auVar19._16_4_ = uVar59;
              auVar19._20_4_ = uVar59;
              auVar19._24_4_ = uVar59;
              auVar19._28_4_ = uVar59;
              auVar41 = vmulps_avx512vl(local_25e0,auVar19);
              uVar17 = vcmpps_avx512vl(auVar41,local_2600,1);
              fVar3 = (ray->super_RayK<1>).tfar;
              auVar20._4_4_ = fVar3;
              auVar20._0_4_ = fVar3;
              auVar20._8_4_ = fVar3;
              auVar20._12_4_ = fVar3;
              auVar20._16_4_ = fVar3;
              auVar20._20_4_ = fVar3;
              auVar20._24_4_ = fVar3;
              auVar20._28_4_ = fVar3;
              auVar41 = vmulps_avx512vl(local_25e0,auVar20);
              uVar14 = vcmpps_avx512vl(local_2600,auVar41,2);
              local_25bf = (byte)uVar17 & (byte)uVar14 & local_25bf;
              if (local_25bf != 0) {
                auVar41 = vsubps_avx(local_25e0,auVar72);
                local_2640 = vblendps_avx(auVar70,auVar41,0xf0);
                auVar41 = vsubps_avx(local_25e0,auVar70);
                local_2620 = vblendps_avx(auVar72,auVar41,0xf0);
                fVar3 = (float)DAT_02060940;
                local_2540._0_4_ = auVar39._0_4_ * fVar3;
                fVar8 = DAT_02060940._4_4_;
                local_2540._4_4_ = auVar39._4_4_ * fVar8;
                fVar9 = DAT_02060940._8_4_;
                local_2540._8_4_ = auVar39._8_4_ * fVar9;
                fVar10 = DAT_02060940._12_4_;
                local_2540._12_4_ = auVar39._12_4_ * fVar10;
                fVar11 = DAT_02060940._16_4_;
                local_2540._16_4_ = fVar11 * 0.0;
                fVar12 = DAT_02060940._20_4_;
                local_2540._20_4_ = fVar12 * 0.0;
                fVar13 = DAT_02060940._24_4_;
                local_2540._24_4_ = fVar13 * 0.0;
                local_2540._28_4_ = 0;
                local_2520._4_4_ = auVar7._4_4_ * fVar8;
                local_2520._0_4_ = auVar7._0_4_ * fVar3;
                local_2520._8_4_ = auVar7._8_4_ * fVar9;
                local_2520._12_4_ = auVar7._12_4_ * fVar10;
                local_2520._16_4_ = fVar11 * 0.0;
                local_2520._20_4_ = fVar12 * 0.0;
                local_2520._24_4_ = fVar13 * 0.0;
                local_2520._28_4_ = 0;
                local_2500._4_4_ = fVar62 * fVar8;
                local_2500._0_4_ = fVar60 * fVar3;
                local_2500._8_4_ = fVar63 * fVar9;
                local_2500._12_4_ = fVar64 * fVar10;
                local_2500._16_4_ = fVar11 * 0.0;
                local_2500._20_4_ = fVar12 * 0.0;
                local_2500._24_4_ = fVar13 * 0.0;
                local_2500._28_4_ = 0;
                local_26d0 = context->scene;
                auVar41 = vrcp14ps_avx512vl(local_25e0);
                auVar21._8_4_ = 0x3f800000;
                auVar21._0_8_ = &DAT_3f8000003f800000;
                auVar21._12_4_ = 0x3f800000;
                auVar21._16_4_ = 0x3f800000;
                auVar21._20_4_ = 0x3f800000;
                auVar21._24_4_ = 0x3f800000;
                auVar21._28_4_ = 0x3f800000;
                auVar42 = vfnmadd213ps_avx512vl(local_25e0,auVar41,auVar21);
                auVar40 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
                fVar60 = auVar40._0_4_;
                fVar62 = auVar40._4_4_;
                local_2560._4_4_ = fVar62 * local_2600._4_4_;
                local_2560._0_4_ = fVar60 * local_2600._0_4_;
                fVar63 = auVar40._8_4_;
                local_2560._8_4_ = fVar63 * local_2600._8_4_;
                fVar64 = auVar40._12_4_;
                local_2560._12_4_ = fVar64 * local_2600._12_4_;
                local_2560._16_4_ = fVar55 * 0.0;
                local_2560._20_4_ = fVar78 * 0.0;
                local_2560._24_4_ = fVar79 * 0.0;
                local_2560._28_4_ = DAT_02060940._28_4_;
                auVar58 = ZEXT3264(local_2560);
                local_25a0[0] = local_2640._0_4_ * fVar60;
                local_25a0[1] = local_2640._4_4_ * fVar62;
                local_25a0[2] = local_2640._8_4_ * fVar63;
                local_25a0[3] = local_2640._12_4_ * fVar64;
                fStack_2590 = local_2640._16_4_ * 0.0;
                fStack_258c = local_2640._20_4_ * 0.0;
                fStack_2588 = local_2640._24_4_ * 0.0;
                uStack_2584 = auVar41._28_4_;
                local_2580[0] = local_2620._0_4_ * fVar60;
                local_2580[1] = local_2620._4_4_ * fVar62;
                local_2580[2] = local_2620._8_4_ * fVar63;
                local_2580[3] = local_2620._12_4_ * fVar64;
                fStack_2570 = local_2620._16_4_ * 0.0;
                fStack_256c = local_2620._20_4_ * 0.0;
                fStack_2568 = local_2620._24_4_ * 0.0;
                uStack_2564 = auVar41._28_4_;
                auVar56._8_4_ = 0x7f800000;
                auVar56._0_8_ = 0x7f8000007f800000;
                auVar56._12_4_ = 0x7f800000;
                auVar56._16_4_ = 0x7f800000;
                auVar56._20_4_ = 0x7f800000;
                auVar56._24_4_ = 0x7f800000;
                auVar56._28_4_ = 0x7f800000;
                auVar41 = vblendmps_avx512vl(auVar56,local_2560);
                auVar53._0_4_ =
                     (uint)(local_25bf & 1) * auVar41._0_4_ |
                     (uint)!(bool)(local_25bf & 1) * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 1 & 1);
                auVar53._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 2 & 1);
                auVar53._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 3 & 1);
                auVar53._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 4 & 1);
                auVar53._16_4_ = (uint)bVar6 * auVar41._16_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 5 & 1);
                auVar53._20_4_ = (uint)bVar6 * auVar41._20_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_25bf >> 6 & 1);
                auVar53._24_4_ = (uint)bVar6 * auVar41._24_4_ | (uint)!bVar6 * 0x7f800000;
                auVar53._28_4_ =
                     (uint)(local_25bf >> 7) * auVar41._28_4_ |
                     (uint)!(bool)(local_25bf >> 7) * 0x7f800000;
                auVar41 = vshufps_avx(auVar53,auVar53,0xb1);
                auVar41 = vminps_avx(auVar53,auVar41);
                auVar42 = vshufpd_avx(auVar41,auVar41,5);
                auVar41 = vminps_avx(auVar41,auVar42);
                auVar42 = vpermpd_avx2(auVar41,0x4e);
                auVar41 = vminps_avx(auVar41,auVar42);
                uVar17 = vcmpps_avx512vl(auVar53,auVar41,0);
                bVar28 = (byte)uVar17 & local_25bf;
                local_2734 = (uint)local_25bf;
                uVar74 = (uint)bVar28;
                if (bVar28 == 0) {
                  uVar74 = local_2734;
                }
                uVar33 = 0;
                for (uVar32 = (ulong)uVar74; (uVar32 & 1) == 0;
                    uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                  uVar33 = uVar33 + 1;
                }
                do {
                  local_2678 = *(uint *)((long)&local_23c0 + uVar33 * 4);
                  local_2710 = (ulong)local_2678;
                  local_2708 = (local_26d0->geometries).items[local_2678].ptr;
                  if ((local_2708->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_2734 = (uint)(~(byte)(1 << ((uint)uVar33 & 0x1f)) & (byte)local_2734);
                    bVar6 = true;
                  }
                  else {
                    local_2718 = context->args;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_2708->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar6 = false;
                    }
                    else {
                      local_24e0 = auVar58._0_32_;
                      local_24c0 = auVar92._0_32_;
                      local_24a0 = auVar91._0_32_;
                      local_2480 = auVar90._0_32_;
                      local_2460 = auVar89._0_32_;
                      local_2440 = auVar87._0_32_;
                      local_2420 = auVar86._0_32_;
                      local_2400 = auVar85._0_32_;
                      local_26c0.context = context->user;
                      local_2690 = *(float *)(local_2540 + uVar33 * 4);
                      local_268c = *(undefined4 *)(local_2520 + uVar33 * 4);
                      local_2688 = *(undefined4 *)(local_2500 + uVar33 * 4);
                      local_2684 = local_25a0[uVar33];
                      local_2680 = local_2580[uVar33];
                      local_267c = *(undefined4 *)((long)&local_2660 + uVar33 * 4);
                      local_2674 = (local_26c0.context)->instID[0];
                      local_2670 = (local_26c0.context)->instPrimID[0];
                      fVar55 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar33 * 4);
                      local_271c = -1;
                      local_26c0.valid = &local_271c;
                      local_26c0.geometryUserPtr = local_2708->userPtr;
                      local_26c0.ray = (RTCRayN *)ray;
                      local_26c0.hit = (RTCHitN *)&local_2690;
                      local_26c0.N = 1;
                      if ((local_2708->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_2708->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0))
                      {
                        if (local_2718->filter != (RTCFilterFunctionN)0x0) {
                          if (((local_2718->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_2708->field_8).field_0x2 & 0x40) != 0)) {
                            (*local_2718->filter)(&local_26c0);
                          }
                          if (*local_26c0.valid == 0) goto LAB_01fc6cac;
                        }
                        (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_26c0.hit;
                        (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_26c0.hit + 4);
                        (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_26c0.hit + 8);
                        *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
                        *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
                        *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
                        *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
                        *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
                        *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
                      }
                      else {
LAB_01fc6cac:
                        (ray->super_RayK<1>).tfar = fVar55;
                      }
                      auVar58 = ZEXT3264(local_24e0);
                      fVar55 = (ray->super_RayK<1>).tfar;
                      auVar22._4_4_ = fVar55;
                      auVar22._0_4_ = fVar55;
                      auVar22._8_4_ = fVar55;
                      auVar22._12_4_ = fVar55;
                      auVar22._16_4_ = fVar55;
                      auVar22._20_4_ = fVar55;
                      auVar22._24_4_ = fVar55;
                      auVar22._28_4_ = fVar55;
                      uVar17 = vcmpps_avx512vl(local_24e0,auVar22,2);
                      local_2734 = (uint)(~(byte)(1 << ((uint)uVar33 & 0x1f)) & (byte)local_2734) &
                                   (uint)uVar17;
                      bVar6 = true;
                      auVar85 = ZEXT3264(local_2400);
                      auVar86 = ZEXT3264(local_2420);
                      auVar87 = ZEXT3264(local_2440);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar88 = ZEXT3264(auVar41);
                      auVar89 = ZEXT3264(local_2460);
                      auVar90 = ZEXT3264(local_2480);
                      auVar91 = ZEXT3264(local_24a0);
                      auVar92 = ZEXT3264(local_24c0);
                      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                      auVar93 = ZEXT3264(auVar41);
                      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                      auVar94 = ZEXT3264(auVar41);
                      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                      auVar95 = ZEXT1664(auVar40);
                      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar96 = ZEXT3264(auVar41);
                      auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                      auVar97 = ZEXT3264(auVar41);
                    }
                  }
                  if (!bVar6) {
                    fVar55 = local_25a0[uVar33];
                    fVar60 = local_2580[uVar33];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar33 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2540 + uVar33 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_2520 + uVar33 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2500 + uVar33 * 4);
                    ray->u = fVar55;
                    ray->v = fVar60;
                    ray->primID = *(uint *)((long)&local_2660 + uVar33 * 4);
                    ray->geomID = (uint)local_2710;
                    pRVar5 = context->user;
                    ray->instID[0] = pRVar5->instID[0];
                    ray->instPrimID[0] = pRVar5->instPrimID[0];
                    break;
                  }
                  bVar28 = (byte)local_2734;
                  if (bVar28 == 0) break;
                  auVar57._8_4_ = 0x7f800000;
                  auVar57._0_8_ = 0x7f8000007f800000;
                  auVar57._12_4_ = 0x7f800000;
                  auVar57._16_4_ = 0x7f800000;
                  auVar57._20_4_ = 0x7f800000;
                  auVar57._24_4_ = 0x7f800000;
                  auVar57._28_4_ = 0x7f800000;
                  auVar41 = vblendmps_avx512vl(auVar57,auVar58._0_32_);
                  auVar54._0_4_ =
                       (uint)(bVar28 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 3) & 1);
                  auVar54._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 4) & 1);
                  auVar54._16_4_ = (uint)bVar6 * auVar41._16_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 5) & 1);
                  auVar54._20_4_ = (uint)bVar6 * auVar41._20_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(local_2734 >> 6) & 1);
                  auVar54._24_4_ = (uint)bVar6 * auVar41._24_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar54._28_4_ =
                       (local_2734 >> 7) * auVar41._28_4_ |
                       (uint)!SUB41(local_2734 >> 7,0) * 0x7f800000;
                  auVar41 = vshufps_avx(auVar54,auVar54,0xb1);
                  auVar41 = vminps_avx(auVar54,auVar41);
                  auVar42 = vshufpd_avx(auVar41,auVar41,5);
                  auVar41 = vminps_avx(auVar41,auVar42);
                  auVar42 = vpermpd_avx2(auVar41,0x4e);
                  auVar41 = vminps_avx(auVar41,auVar42);
                  uVar17 = vcmpps_avx512vl(auVar54,auVar41,0);
                  bVar28 = (byte)uVar17 & bVar28;
                  uVar74 = local_2734;
                  if (bVar28 != 0) {
                    uVar74 = (uint)bVar28;
                  }
                  uVar75 = 0;
                  for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                    uVar75 = uVar75 + 1;
                  }
                  uVar33 = (ulong)uVar75;
                } while( true );
              }
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != uVar34 - 8);
        }
        fVar55 = (ray->super_RayK<1>).tfar;
        auVar58 = ZEXT3264(CONCAT428(fVar55,CONCAT424(fVar55,CONCAT420(fVar55,CONCAT416(fVar55,
                                                  CONCAT412(fVar55,CONCAT48(fVar55,CONCAT44(fVar55,
                                                  fVar55))))))));
        auVar73 = ZEXT3264(local_23e0);
        uVar34 = local_26c8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }